

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkPointFrame.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChLinkPointFrame::IntLoadResidual_CqL
          (ChLinkPointFrame *this,uint off_L,ChVectorDynamic<> *R,ChVectorDynamic<> *L,double c)

{
  int iVar1;
  CoeffReturnType pdVar2;
  
  iVar1 = (*(this->super_ChLinkBase).super_ChPhysicsItem.super_ChObj._vptr_ChObj[9])();
  if ((char)iVar1 != '\0') {
    pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)L,(ulong)off_L
                       );
    ChConstraintTwoGeneric::MultiplyTandAdd(&this->constraint1,R,c * *pdVar2);
    pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)L,
                        (ulong)(off_L + 1));
    ChConstraintTwoGeneric::MultiplyTandAdd(&this->constraint2,R,c * *pdVar2);
    pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)L,
                        (ulong)(off_L + 2));
    ChConstraintTwoGeneric::MultiplyTandAdd(&this->constraint3,R,c * *pdVar2);
    return;
  }
  return;
}

Assistant:

void ChLinkPointFrame::IntLoadResidual_CqL(const unsigned int off_L,    // offset in L multipliers
                                           ChVectorDynamic<>& R,        // result: the R residual, R += c*Cq'*L
                                           const ChVectorDynamic<>& L,  // the L vector
                                           const double c               // a scaling factor
) {
    if (!IsActive())
        return;

    constraint1.MultiplyTandAdd(R, L(off_L + 0) * c);
    constraint2.MultiplyTandAdd(R, L(off_L + 1) * c);
    constraint3.MultiplyTandAdd(R, L(off_L + 2) * c);
}